

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

ssize_t __thiscall Corrade::Utility::Path::write(Path *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  char *__filename;
  FILE *__s;
  undefined4 extraout_var;
  Debug *pDVar3;
  int *piVar4;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  StringView view;
  StringView value;
  Error err;
  Error local_50;
  undefined8 uVar2;
  
  view._sizePlusFlags = __n;
  view._data = (char *)CONCAT44(in_register_00000034,__fd);
  Containers::String::nullTerminatedView((String *)&local_50,(String *)this,view);
  __filename = Containers::String::data((String *)&local_50);
  __s = fopen(__filename,"wb");
  Containers::String::~String((String *)&local_50);
  if (__s == (FILE *)0x0) {
    Error::Error(&local_50,(Flags)0x0);
    pDVar3 = Debug::operator<<(&local_50.super_Debug,"Utility::Path::write(): can\'t open");
    value._sizePlusFlags = (size_t)CONCAT44(in_register_00000034,__fd);
    value._data = (char *)this;
    pDVar3 = Debug::operator<<(pDVar3,value);
    (pDVar3->_immediateFlags)._value = (pDVar3->_immediateFlags)._value | 4;
    Debug::operator<<(pDVar3,":");
    piVar4 = __errno_location();
    Implementation::printErrnoErrorString(&local_50.super_Debug,*piVar4);
    Error::~Error(&local_50);
    uVar2 = extraout_RAX;
  }
  else {
    fwrite(__buf,1,__n,__s);
    iVar1 = fclose(__s);
    uVar2 = CONCAT44(extraout_var,iVar1);
  }
  return CONCAT71((int7)((ulong)uVar2 >> 8),__s != (FILE *)0x0);
}

Assistant:

bool write(const Containers::StringView filename, const Containers::ArrayView<const void> data) {
    /* Special case for "Unicode" Windows support */
    #ifndef CORRADE_TARGET_WINDOWS
    std::FILE* const f = std::fopen(Containers::String::nullTerminatedView(filename).data(), "wb");
    #else
    std::FILE* const f = _wfopen(Unicode::widen(filename), L"wb");
    #endif
    if(!f) {
        Error err;
        err << "Utility::Path::write(): can't open" << filename << Debug::nospace << ":";
        Utility::Implementation::printErrnoErrorString(err, errno);
        return false;
    }

    Containers::ScopeGuard exit{f, std::fclose};

    std::fwrite(data, 1, data.size(), f);
    return true;
}